

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ShellCommand::start(ShellCommand *this,BuildSystem *system,TaskInterface ti)

{
  HandlerState *pHVar1;
  _Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false> _Var2;
  ShellCommandHandler *pSVar3;
  _Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false> local_30;
  
  pSVar3 = BuildSystem::resolveShellCommandHandler(system,this);
  this->handler = pSVar3;
  if (pSVar3 != (ShellCommandHandler *)0x0) {
    (*pSVar3->_vptr_ShellCommandHandler[2])(&local_30,pSVar3,ti.impl,ti.ctx,this);
    _Var2._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (HandlerState *)0x0;
    pHVar1 = (this->handlerState)._M_t.
             super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl;
    (this->handlerState)._M_t.
    super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
    .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl =
         _Var2._M_head_impl;
    if (pHVar1 != (HandlerState *)0x0) {
      (*pHVar1->_vptr_HandlerState[1])();
      if (local_30._M_head_impl != (HandlerState *)0x0) {
        (*(local_30._M_head_impl)->_vptr_HandlerState[1])();
      }
    }
  }
  ExternalCommand::start(&this->super_ExternalCommand,system,ti);
  return;
}

Assistant:

void ShellCommand::start(BuildSystem& system, TaskInterface ti) {
  // Resolve the plugin state.
  handler = system.resolveShellCommandHandler(this);

  // Delegate to handler, if used.
  if (handler) {
    handlerState = handler->start(ti, this);
  }

  this->ExternalCommand::start(system, ti);
}